

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pose.h
# Opt level: O0

Vector6d * gmath::getPose(Matrix33d *R,Vector3d *T)

{
  double *pdVar1;
  SVector<double,_3> *in_RDX;
  SMatrix *in_RSI;
  SVector<double,_6> *in_RDI;
  double dVar2;
  double dVar3;
  double v1;
  double v2;
  double phi;
  Vector3d n;
  Vector6d *pose;
  SVector<double,_3> local_30;
  SVector<double,_3> *local_18;
  SMatrix *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  SVector<double,_3>::SVector(&local_30);
  dVar2 = (double)gmath::recoverAngleAxis(local_10,(SVector *)&local_30);
  dVar3 = SVector<double,_3>::operator[](local_18,0);
  v1 = SVector<double,_3>::operator[](local_18,1);
  v2 = SVector<double,_3>::operator[](local_18,2);
  SVector<double,_6>::SVector(in_RDI,dVar3,v1,v2,0.0,0.0,0.0);
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    pdVar1 = SVector<double,_3>::operator[](&local_30,0);
    dVar3 = *pdVar1;
    pdVar1 = SVector<double,_6>::operator[](in_RDI,3);
    *pdVar1 = dVar3 * dVar2;
    pdVar1 = SVector<double,_3>::operator[](&local_30,1);
    dVar3 = *pdVar1;
    pdVar1 = SVector<double,_6>::operator[](in_RDI,4);
    *pdVar1 = dVar3 * dVar2;
    pdVar1 = SVector<double,_3>::operator[](&local_30,2);
    dVar3 = *pdVar1;
    pdVar1 = SVector<double,_6>::operator[](in_RDI,5);
    *pdVar1 = dVar3 * dVar2;
  }
  return in_RDI;
}

Assistant:

inline Vector6d getPose(const Matrix33d &R, const Vector3d &T)
{
  Vector3d n;
  double   phi=recoverAngleAxis(R, n);
  Vector6d pose(T[0], T[1], T[2], 0, 0, 0);

  if (phi != 0)
  {
    pose[3]=n[0]*phi;
    pose[4]=n[1]*phi;
    pose[5]=n[2]*phi;
  }

  return pose;
}